

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTBITEnc(octet *der,u32 tag,octet *val,size_t len)

{
  octet *poVar1;
  bool bVar2;
  bool_t bVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  byte bVar7;
  size_t sVar8;
  long lVar9;
  octet *der_00;
  ulong len_00;
  size_t sVar10;
  
  uVar5 = (ulong)tag;
  bVar3 = derTIsValid(tag);
  sVar8 = 0xffffffffffffffff;
  if (bVar3 != 0) {
    lVar9 = 0;
    if (tag != 0) {
      do {
        lVar9 = lVar9 + 1;
        uVar4 = (uint)uVar5;
        uVar5 = uVar5 >> 8;
      } while (0xff < uVar4);
    }
    sVar8 = lVar9 + (ulong)(lVar9 == 0);
  }
  if (sVar8 != 0xffffffffffffffff) {
    len_00 = len + 0xf >> 3;
    sVar10 = 1;
    uVar5 = len_00;
    if (0x3ff < len + 0xf) {
      do {
        sVar10 = sVar10 + 1;
        bVar2 = 0xff < uVar5;
        uVar5 = uVar5 >> 8;
      } while (bVar2);
    }
    if (der != (octet *)0x0) {
      der_00 = der + sVar8;
      poVar1 = der_00 + sVar10;
      memMove(der_00 + sVar10 + 1,val,len + 7 >> 3);
      if ((len & 7) == 0) {
        *poVar1 = '\0';
      }
      else {
        bVar7 = 8 - (char)(len & 7);
        poVar1[(len >> 3) + 1] = poVar1[(len >> 3) + 1] & (byte)(-1 << (bVar7 & 0x1f));
        der_00[sVar10] = bVar7;
      }
      sVar6 = derTEnc(der,tag);
      if (sVar6 != sVar8) {
        return 0xffffffffffffffff;
      }
      sVar6 = derLEnc(der_00,len_00);
      if (sVar6 != sVar10) {
        return 0xffffffffffffffff;
      }
    }
    return sVar8 + len_00 + sVar10;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t derTBITEnc(octet der[], u32 tag, const octet* val, size_t len)
{
	size_t t_count;
	size_t l_count;
	// кодировать T
	t_count = derTEnc(0, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать L
	l_count = derLEnc(0, (len + 15) / 8);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать
	if (der)
	{
		// V
		memMove(der + t_count + l_count + 1, val, (len + 7) / 8);
		if (len % 8)
		{
			der[t_count + l_count + 1 + len / 8] >>= 8 - len % 8;
			der[t_count + l_count + 1 + len / 8] <<= 8 - len % 8;
			der[t_count + l_count] = 8 - len % 8;
		}
		else
			der[t_count + l_count] = 0;
		// TL
		if (derTEnc(der, tag) != t_count ||
			derLEnc(der + t_count, (len + 15) / 8) != l_count)
			return SIZE_MAX;
	}
	return t_count + l_count + (len + 15) / 8;
}